

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void __thiscall
testing::internal::PrettyUnitTestResultPrinter::OnTestIterationEnd
          (PrettyUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  _Alloc_hider _Var1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int test_count;
  int test_suite_count;
  int test_count_00;
  int test_count_01;
  int test_count_02;
  undefined4 in_register_00000014;
  char *pcVar5;
  string local_60;
  string local_40;
  
  ColoredPrintf(COLOR_GREEN,"[==========] ",CONCAT44(in_register_00000014,param_2));
  uVar3 = UnitTest::test_to_run_count(unit_test);
  FormatTestCount_abi_cxx11_(&local_60,(testing *)(ulong)uVar3,test_count);
  _Var1._M_p = local_60._M_dataplus._M_p;
  uVar3 = UnitTest::test_suite_to_run_count(unit_test);
  FormatTestSuiteCount_abi_cxx11_(&local_40,(testing *)(ulong)uVar3,test_suite_count);
  printf("%s from %s ran.",_Var1._M_p,local_40._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  if (FLAGS_gtest_print_time == '\x01') {
    local_40._M_dataplus._M_p = (pointer)unit_test->impl_->elapsed_time_;
    StreamableToString<long_long>(&local_60,(longlong *)&local_40);
    printf(" (%s ms total)",local_60._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_60);
  }
  putchar(10);
  ColoredPrintf(COLOR_GREEN,"[  PASSED  ] ");
  uVar3 = UnitTest::successful_test_count(unit_test);
  FormatTestCount_abi_cxx11_(&local_60,(testing *)(ulong)uVar3,test_count_00);
  printf("%s.\n",local_60._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_60);
  uVar3 = UnitTest::skipped_test_count(unit_test);
  if (0 < (int)uVar3) {
    ColoredPrintf(COLOR_GREEN,"[  SKIPPED ] ");
    FormatTestCount_abi_cxx11_(&local_60,(testing *)(ulong)uVar3,test_count_01);
    printf("%s, listed below:\n",local_60._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_60);
    PrintSkippedTests(unit_test);
  }
  uVar3 = UnitTest::failed_test_count(unit_test);
  bVar2 = UnitTest::Passed(unit_test);
  if (!bVar2) {
    uVar4 = UnitTest::failed_test_count(unit_test);
    ColoredPrintf(COLOR_RED,"[  FAILED  ] ");
    FormatTestCount_abi_cxx11_(&local_60,(testing *)(ulong)uVar4,test_count_02);
    printf("%s, listed below:\n",local_60._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_60);
    PrintFailedTests(unit_test);
    pcVar5 = "TESTS";
    if (uVar3 == 1) {
      pcVar5 = "TEST";
    }
    printf("\n%2d FAILED %s\n",(ulong)uVar3,pcVar5);
  }
  uVar4 = UnitTest::reportable_disabled_test_count(unit_test);
  if ((uVar4 != 0) && (FLAGS_gtest_also_run_disabled_tests == '\0')) {
    if (uVar3 == 0) {
      putchar(10);
    }
    pcVar5 = "TESTS";
    if (uVar4 == 1) {
      pcVar5 = "TEST";
    }
    ColoredPrintf(COLOR_YELLOW,"  YOU HAVE %d DISABLED %s\n\n",(ulong)uVar4,pcVar5);
  }
  fflush(_stdout);
  return;
}

Assistant:

void PrettyUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                     int /*iteration*/) {
  ColoredPrintf(COLOR_GREEN,  "[==========] ");
  printf("%s from %s ran.",
         FormatTestCount(unit_test.test_to_run_count()).c_str(),
         FormatTestSuiteCount(unit_test.test_suite_to_run_count()).c_str());
  if (GTEST_FLAG(print_time)) {
    printf(" (%s ms total)",
           internal::StreamableToString(unit_test.elapsed_time()).c_str());
  }
  printf("\n");
  ColoredPrintf(COLOR_GREEN,  "[  PASSED  ] ");
  printf("%s.\n", FormatTestCount(unit_test.successful_test_count()).c_str());

  const int skipped_test_count = unit_test.skipped_test_count();
  if (skipped_test_count > 0) {
    ColoredPrintf(COLOR_GREEN, "[  SKIPPED ] ");
    printf("%s, listed below:\n", FormatTestCount(skipped_test_count).c_str());
    PrintSkippedTests(unit_test);
  }

  int num_failures = unit_test.failed_test_count();
  if (!unit_test.Passed()) {
    const int failed_test_count = unit_test.failed_test_count();
    ColoredPrintf(COLOR_RED,  "[  FAILED  ] ");
    printf("%s, listed below:\n", FormatTestCount(failed_test_count).c_str());
    PrintFailedTests(unit_test);
    printf("\n%2d FAILED %s\n", num_failures,
                        num_failures == 1 ? "TEST" : "TESTS");
  }

  int num_disabled = unit_test.reportable_disabled_test_count();
  if (num_disabled && !GTEST_FLAG(also_run_disabled_tests)) {
    if (!num_failures) {
      printf("\n");  // Add a spacer if no FAILURE banner is displayed.
    }
    ColoredPrintf(COLOR_YELLOW,
                  "  YOU HAVE %d DISABLED %s\n\n",
                  num_disabled,
                  num_disabled == 1 ? "TEST" : "TESTS");
  }
  // Ensure that Google Test output is printed before, e.g., heapchecker output.
  fflush(stdout);
}